

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O2

void Rml::Parse::Relational(DataParser *parser)

{
  char cVar1;
  Instruction IVar2;
  Variant VStack_58;
  
  Additive(parser);
  do {
    if (parser->reached_end != false) {
      return;
    }
    cVar1 = (parser->expression)._M_dataplus._M_p[parser->index];
    if (cVar1 == '!') {
      DataParser::Match(parser,'!',false);
      DataParser::Match(parser,'=',true);
      DataParser::Push(parser);
      Additive(parser);
      DataParser::Pop(parser,L);
      Variant::Variant(&VStack_58);
      DataParser::Emit(parser,NotEqual,&VStack_58);
    }
    else if (cVar1 == '<') {
      DataParser::Match(parser,'<',false);
      if ((parser->reached_end == false) &&
         ((parser->expression)._M_dataplus._M_p[parser->index] == '=')) {
        DataParser::Match(parser,'=',true);
        IVar2 = LessEq;
      }
      else {
        DataParser::SkipWhitespace(parser);
        IVar2 = Less;
      }
      DataParser::Push(parser);
      Additive(parser);
      DataParser::Pop(parser,L);
      Variant::Variant(&VStack_58);
      DataParser::Emit(parser,IVar2,&VStack_58);
    }
    else if (cVar1 == '>') {
      DataParser::Match(parser,'>',false);
      if ((parser->reached_end == false) &&
         ((parser->expression)._M_dataplus._M_p[parser->index] == '=')) {
        DataParser::Match(parser,'=',true);
        IVar2 = GreaterEq;
      }
      else {
        DataParser::SkipWhitespace(parser);
        IVar2 = Greater;
      }
      DataParser::Push(parser);
      Additive(parser);
      DataParser::Pop(parser,L);
      Variant::Variant(&VStack_58);
      DataParser::Emit(parser,IVar2,&VStack_58);
    }
    else {
      if (cVar1 != '=') {
        return;
      }
      DataParser::Match(parser,'=',false);
      DataParser::Match(parser,'=',true);
      DataParser::Push(parser);
      Additive(parser);
      DataParser::Pop(parser,L);
      Variant::Variant(&VStack_58);
      DataParser::Emit(parser,Equal,&VStack_58);
    }
    Variant::~Variant(&VStack_58);
  } while( true );
}

Assistant:

static void Relational(DataParser& parser)
	{
		Additive(parser);

		bool looping = true;
		while (looping)
		{
			switch (parser.Look())
			{
			case '=': Equal(parser); break;
			case '!': NotEqual(parser); break;
			case '<': Less(parser); break;
			case '>': Greater(parser); break;
			default: looping = false;
			}
		}
	}